

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

SimpleString StringFromBinary(uchar *value,size_t size)

{
  char *pcVar1;
  long in_RDX;
  size_t extraout_RDX;
  long lVar2;
  SimpleString SVar3;
  SimpleString local_40;
  
  value[0] = '\0';
  value[1] = '\0';
  value[2] = '\0';
  value[3] = '\0';
  value[4] = '\0';
  value[5] = '\0';
  value[6] = '\0';
  value[7] = '\0';
  value[8] = '\0';
  value[9] = '\0';
  value[10] = '\0';
  value[0xb] = '\0';
  value[0xc] = '\0';
  value[0xd] = '\0';
  value[0xe] = '\0';
  value[0xf] = '\0';
  SimpleString::copyBufferToNewInternalBuffer((SimpleString *)value,"");
  if (in_RDX != 0) {
    lVar2 = 0;
    do {
      StringFromFormat((char *)&local_40,"%02X ",(ulong)*(byte *)(size + lVar2));
      SimpleString::operator+=((SimpleString *)value,local_40.buffer_);
      SimpleString::deallocateInternalBuffer(&local_40);
      lVar2 = lVar2 + 1;
    } while (in_RDX != lVar2);
  }
  lVar2 = -2;
  do {
    pcVar1 = (char *)(*(long *)value + 2 + lVar2);
    lVar2 = lVar2 + 1;
  } while (*pcVar1 != '\0');
  SimpleString::subString(&local_40,(size_t)value,0);
  SimpleString::copyBufferToNewInternalBuffer((SimpleString *)value,&local_40);
  SimpleString::deallocateInternalBuffer(&local_40);
  SVar3.bufferSize_ = extraout_RDX;
  SVar3.buffer_ = (char *)value;
  return SVar3;
}

Assistant:

SimpleString StringFromBinary(const unsigned char* value, size_t size)
{
    SimpleString result;

    for (size_t i = 0; i < size; i++) {
        result += StringFromFormat("%02X ", value[i]);
    }
    result = result.subString(0, result.size() - 1);

    return result;
}